

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

Fxch_Man_t * Fxch_ManAlloc(Vec_Wec_t *vCubes)

{
  uint nCap;
  ulong uVar1;
  uint uVar2;
  Fxch_Man_t *pFVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Int_t *pVVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  Vec_Wec_t *pVVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  pFVar3 = (Fxch_Man_t *)calloc(1,0xd8);
  pFVar3->vCubes = vCubes;
  pFVar3->nCubesInit = vCubes->nSize;
  pHVar4 = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar9 = 0x3ff;
  do {
    do {
      nCap = uVar9 + 1;
      uVar2 = uVar9 & 1;
      uVar9 = nCap;
    } while (uVar2 != 0);
    uVar11 = 3;
    do {
      iVar10 = (int)uVar11;
      if (nCap < (uint)(iVar10 * iVar10)) {
        pVVar5 = Vec_IntAlloc(nCap);
        pVVar5->nSize = nCap;
        if (pVVar5->pArray != (int *)0x0) {
          memset(pVVar5->pArray,0xff,(long)(int)nCap << 2);
        }
        pHVar4->vTable = pVVar5;
        pVVar5 = Vec_IntAlloc(0x1000);
        pHVar4->vData = pVVar5;
        pVVar5 = Vec_IntAlloc(0x400);
        pHVar4->vMap = pVVar5;
        pFVar3->pDivHash = pHVar4;
        pVVar6 = (Vec_Flt_t *)malloc(0x10);
        pVVar6->nCap = 0x400;
        pVVar6->nSize = 0;
        pfVar7 = (float *)malloc(0x1000);
        pVVar6->pArray = pfVar7;
        pFVar3->vDivWeights = pVVar6;
        pVVar8 = Vec_WecAlloc(0x400);
        pFVar3->vDivCubePairs = pVVar8;
        pVVar5 = Vec_IntAlloc(4);
        pFVar3->vCubeFree = pVVar5;
        pVVar5 = Vec_IntAlloc(4);
        pFVar3->vDiv = pVVar5;
        pVVar5 = Vec_IntAlloc(0x80);
        pFVar3->vCubesS = pVVar5;
        pVVar5 = Vec_IntAlloc(0x80);
        pFVar3->vPairs = pVVar5;
        pVVar5 = Vec_IntAlloc(0x40);
        pFVar3->vCubesToUpdate = pVVar5;
        pVVar5 = Vec_IntAlloc(0x40);
        pFVar3->vCubesToRemove = pVVar5;
        pVVar5 = Vec_IntAlloc(0x40);
        pFVar3->vSCC = pVVar5;
        return pFVar3;
      }
      uVar1 = (ulong)nCap % uVar11;
      uVar11 = (ulong)(iVar10 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

Fxch_Man_t* Fxch_ManAlloc( Vec_Wec_t* vCubes )
{
    Fxch_Man_t* pFxchMan = ABC_CALLOC( Fxch_Man_t, 1 );

    pFxchMan->vCubes = vCubes;
    pFxchMan->nCubesInit = Vec_WecSize( vCubes );

    pFxchMan->pDivHash = Hsh_VecManStart( 1024 );
    pFxchMan->vDivWeights = Vec_FltAlloc( 1024 );
    pFxchMan->vDivCubePairs = Vec_WecAlloc( 1024 );

    pFxchMan->vCubeFree = Vec_IntAlloc( 4 );
    pFxchMan->vDiv = Vec_IntAlloc( 4 );

    pFxchMan->vCubesS = Vec_IntAlloc( 128 );
    pFxchMan->vPairs = Vec_IntAlloc( 128 );
    pFxchMan->vCubesToUpdate = Vec_IntAlloc( 64 );
    pFxchMan->vCubesToRemove = Vec_IntAlloc( 64 );
    pFxchMan->vSCC = Vec_IntAlloc( 64 );

    return pFxchMan;
}